

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O3

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  tinfl_status tVar1;
  mz_uint8 *pmVar2;
  mz_uint8 *pOut_buf_next;
  size_t sVar3;
  mz_uint8 *__ptr;
  long lVar4;
  ulong __size;
  undefined1 local_2b50 [8];
  tinfl_decompressor decomp;
  size_t local_48;
  size_t src_buf_size;
  size_t dst_buf_size;
  
  *pOut_len = 0;
  local_2b50._0_4_ = 0;
  dst_buf_size._4_4_ = flags & 0xfffffff9U | 4;
  sVar3 = 0;
  lVar4 = 0;
  __size = 0;
  pmVar2 = (mz_uint8 *)0x0;
  decomp._10992_8_ = src_buf_len;
  do {
    __ptr = pmVar2;
    local_48 = decomp._10992_8_ - lVar4;
    src_buf_size = __size - sVar3;
    if (__ptr == (mz_uint8 *)0x0) {
      pmVar2 = (mz_uint8 *)0x0;
      pOut_buf_next = (mz_uint8 *)0x0;
    }
    else {
      pOut_buf_next = __ptr + sVar3;
      pmVar2 = __ptr;
    }
    tVar1 = tinfl_decompress((tinfl_decompressor *)local_2b50,(mz_uint8 *)((long)pSrc_buf + lVar4),
                             &local_48,pmVar2,pOut_buf_next,&src_buf_size,dst_buf_size._4_4_);
    if ((tVar1 < TINFL_STATUS_DONE) || (tVar1 == TINFL_STATUS_NEEDS_MORE_INPUT)) break;
    lVar4 = lVar4 + local_48;
    sVar3 = *pOut_len + src_buf_size;
    *pOut_len = sVar3;
    if (tVar1 == TINFL_STATUS_DONE) {
      return __ptr;
    }
    __size = __size * 2;
    if (__size < 0x81) {
      __size = 0x80;
    }
    pmVar2 = (mz_uint8 *)realloc(__ptr,__size);
  } while (pmVar2 != (mz_uint8 *)0x0);
  free(__ptr);
  *pOut_len = 0;
  return (void *)0x0;
}

Assistant:

void *tinfl_decompress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len,
    int flags)
{
    tinfl_decompressor decomp;
    void *pBuf = NULL, *pNew_buf;
    size_t src_buf_ofs = 0, out_buf_capacity = 0;
    *pOut_len = 0;
    tinfl_init(&decomp);
    for (;;)
    {
        size_t src_buf_size = src_buf_len - src_buf_ofs,
               dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
        tinfl_status status = tinfl_decompress(
                &decomp, (const mz_uint8*)pSrc_buf + src_buf_ofs, &src_buf_size, (mz_uint8*)pBuf,
                pBuf ? (mz_uint8*)pBuf + *pOut_len : NULL, &dst_buf_size,
                (flags & ~TINFL_FLAG_HAS_MORE_INPUT) | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
        if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT))
        {
            MZ_FREE(pBuf);
            *pOut_len = 0;
            return NULL;
        }
        src_buf_ofs += src_buf_size;
        *pOut_len += dst_buf_size;
        if (status == TINFL_STATUS_DONE)
            break;
        new_out_buf_capacity = out_buf_capacity * 2;
        if (new_out_buf_capacity < 128)
            new_out_buf_capacity = 128;
        pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
        if (!pNew_buf)
        {
            MZ_FREE(pBuf);
            *pOut_len = 0;
            return NULL;
        }
        pBuf = pNew_buf;
        out_buf_capacity = new_out_buf_capacity;
    }
    return pBuf;
}